

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::FlagBase::Validate(FlagBase *this,string *shortPrefix,string *longPrefix)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ostringstream problem;
  EitherFlag EStack_1e8;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  iVar1 = (*(this->super_NamedBase).super_Base._vptr_Base[2])();
  if (((char)iVar1 == '\0') && (((this->super_NamedBase).super_Base.options & Required) != None)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Flag \'",6);
    Matcher::GetLongOrAny(&EStack_1e8,&this->matcher);
    EitherFlag::str(&local_1c0,&EStack_1e8,shortPrefix,longPrefix);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' is required",0xd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)EStack_1e8.longFlag._M_dataplus._M_p != &EStack_1e8.longFlag.field_2) {
      operator_delete(EStack_1e8.longFlag._M_dataplus._M_p);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,(string *)&EStack_1e8);
    *(undefined ***)this_00 = &PTR__runtime_error_0011d9d0;
    __cxa_throw(this_00,&RequiredError::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

virtual void Validate(const std::string &shortPrefix, const std::string &longPrefix) const override
            {
                if (!Matched() && IsRequired())
                {
                        std::ostringstream problem;
                        problem << "Flag '" << matcher.GetLongOrAny().str(shortPrefix, longPrefix) << "' is required";
#ifdef ARGS_NOEXCEPT
                        error = Error::Required;
                        errorMsg = problem.str();
#else
                        throw RequiredError(problem.str());
#endif
                }
            }